

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O2

VCString * __thiscall
mp::pre::VCString::operator+(VCString *__return_storage_ptr__,VCString *this,char (*arg) [6])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->s_,*arg);
  VCString(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

VCString operator+(const T& arg) const
  { return {s_ + arg}; }